

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dictionary.cpp
# Opt level: O0

double __thiscall FIX::Dictionary::getDouble(Dictionary *this,string *key)

{
  double dVar1;
  FieldConvertError *anon_var_0;
  string local_38;
  string *local_18;
  string *key_local;
  Dictionary *this_local;
  
  local_18 = key;
  key_local = (string *)this;
  getString(&local_38,this,key,false);
  dVar1 = DoubleConvertor::convert(&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return dVar1;
}

Assistant:

EXCEPT(ConfigError, FieldConvertError) {
  try {
    return DoubleConvertor::convert(getString(key));
  } catch (FieldConvertError &) {
    throw ConfigError("Illegal value " + getString(key) + " for " + key);
  }
}